

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

uint32_t __thiscall cfd::TransactionContext::AddTxIn(TransactionContext *this,OutPoint *outpoint)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined **local_38;
  void *local_30;
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  iVar2 = cfd::core::AbstractTransaction::GetLockTime();
  uVar3 = cfd::core::Transaction::AddTxIn
                    ((Txid *)this,(uint)&local_38,uVar1,(Script *)(ulong)(iVar2 == 0 | 0xfffffffe));
  local_38 = &PTR__Txid_002b0f00;
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  return uVar3;
}

Assistant:

uint32_t TransactionContext::AddTxIn(const OutPoint& outpoint) {
  return AddTxIn(
      outpoint.GetTxid(), outpoint.GetVout(), GetDefaultSequence(),
      Script::Empty);
}